

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O2

void duckdb_je_extent_destroy_wrapper(tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,edata_t *edata)

{
  extent_hooks_t *peVar1;
  ulong size;
  uint uVar2;
  void *addr;
  
  uVar2 = (uint)edata->e_bits;
  if ((uVar2 >> 0x10 & 1) != 0) {
    duckdb_je_san_unguard_pages_pre_destroy(tsdn,ehooks,edata,pac->emap);
    uVar2 = (uint)edata->e_bits;
  }
  addr = (void *)((ulong)edata->e_addr & 0xfffffffffffff000);
  edata->e_addr = addr;
  size = (edata->field_2).e_size_esn & 0xfffffffffffff000;
  peVar1 = (extent_hooks_t *)(ehooks->ptr).repr;
  if (peVar1 == &duckdb_je_ehooks_default_extent_hooks) {
    duckdb_je_ehooks_default_destroy_impl(addr,size);
  }
  else if (peVar1->destroy != (extent_destroy_t *)0x0) {
    ehooks_pre_reentrancy(tsdn);
    (*peVar1->destroy)(peVar1,addr,size,(_Bool)((byte)(uVar2 >> 0xd) & 1),ehooks->ind);
    ehooks_post_reentrancy(tsdn);
  }
  duckdb_je_edata_cache_put(tsdn,pac->edata_cache,edata);
  return;
}

Assistant:

void
extent_destroy_wrapper(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks,
    edata_t *edata) {
	assert(edata_base_get(edata) != NULL);
	assert(edata_size_get(edata) != 0);
	extent_state_t state = edata_state_get(edata);
	assert(state == extent_state_retained || state == extent_state_active);
	assert(emap_edata_is_acquired(tsdn, pac->emap, edata));
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	if (edata_guarded_get(edata)) {
		assert(opt_retain);
		san_unguard_pages_pre_destroy(tsdn, ehooks, edata, pac->emap);
	}
	edata_addr_set(edata, edata_base_get(edata));

	/* Try to destroy; silently fail otherwise. */
	ehooks_destroy(tsdn, ehooks, edata_base_get(edata),
	    edata_size_get(edata), edata_committed_get(edata));

	edata_cache_put(tsdn, pac->edata_cache, edata);
}